

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdmp.cc
# Opt level: O1

void printStack(ostream *os,shared_ptr<pstack::Procman::Process> *proc,hdbg_info *info,void **frames
               )

{
  undefined8 uVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  size_t sVar4;
  ulong uVar5;
  char *__s;
  type *file;
  undefined8 *puVar6;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined1 local_d0 [8];
  optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  found;
  shared_ptr<pstack::Dwarf::Info> dwarf;
  undefined1 local_78 [8];
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr<pstack::Procman::Process> *local_48;
  ulong local_40;
  void **local_38;
  
  local_48 = proc;
  local_38 = frames;
  if (info->maxframes != 0) {
    uVar5 = 0;
    do {
      if (local_38[uVar5] == (void *)0x0) break;
      local_40 = uVar5;
      pstack::Procman::Process::findSegment((ulong)local_78);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
      std::ostream::_M_insert<void_const*>(os);
      if (local_70 != 0) {
        pstack::Elf::Object::findSymbolByAddress_abi_cxx11_((ulong)local_d0,(int)local_70);
        if (found.
            super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_payload._48_1_ == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(char *)found.
                                         super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_payload._M_value.first.st_size,
                              (long)found.
                                    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_payload._M_value.second._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"+",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        }
        uVar1 = *(undefined8 *)
                 ((local_48->
                  super___shared_ptr<pstack::Procman::Process,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 0xa0);
        local_58 = local_70;
        local_50 = local_68;
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_68 + 8) = *(int *)(local_68 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_68 + 8) = *(int *)(local_68 + 8) + 1;
          }
        }
        pstack::Context::getDwarf
                  (&found.
                    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_engaged,uVar1,&local_58);
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
        if (found.
            super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._56_8_ != 0) {
          pstack::Dwarf::Info::sourceFromAddr_abi_cxx11_((ulong)&local_e8);
          puVar2 = local_e0;
          if (local_e8 != local_e0) {
            __s = "in";
            puVar6 = local_e8;
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              sVar4 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar4);
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 (os,(char *)*puVar6,puVar6[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
              std::ostream::operator<<((ostream *)poVar3,*(int *)(puVar6 + 4));
              puVar6 = puVar6 + 5;
              __s = ",";
            } while (puVar6 != puVar2);
          }
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)&local_e8);
        }
        if (dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        if (found.
            super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_payload._48_1_ == '\x01') {
          found.
          super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_payload._48_1_ = 0;
          if ((undefined1 *)
              found.
              super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_payload._M_value.first.st_size !=
              (undefined1 *)
              ((long)&found.
                      super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_payload + 0x20)) {
            operator_delete((void *)found.
                                    super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_payload._M_value.first.st_size,
                            found.
                            super__Optional_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_payload._M_value.second._M_string_length + 1);
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
      }
      uVar5 = local_40 + 1;
    } while (uVar5 < info->maxframes);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void printStack(std::ostream &os, std::shared_ptr<Procman::Process> &proc, const hdbg_info &info, void **frames) {
   for (size_t i = 0; i < info.maxframes && frames[i] != nullptr; ++i) {
      uintptr_t frameip = uintptr_t(frames[i]);
      if (i != 0)
         frameip--;

      // find the segment containing the instruction pointer.
      auto &&[elfReloc, elf, phdr] = proc->findSegment(frameip);

      os << "\t" << frames[i];
      if (elf) {
         auto found = elf->findSymbolByAddress(frameip - elfReloc, STT_FUNC);
         if (found) {
            auto &[ sym, name ] = *found;
            os << "\t" << name << "+" << uintptr_t(frames[i]) - elfReloc - sym.st_value;
         }

         auto dwarf = proc->context.getDwarf(elf);
         if (dwarf) {
            auto sep = "in";
            for (auto &&[file, line] : dwarf->sourceFromAddr(frameip - elfReloc)) {
               os << " " << sep << " " << file << ":" << line;
               sep = ",";
            }
         }

      }
      os << "\n";
   }
   os << "\n";
}